

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  int iVar1;
  Vdbe *v;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar1 = 0;
  }
  else {
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
    iVar1 = sqlite3VdbeReset((Vdbe *)pStmt);
    *(undefined4 *)(pStmt + 0x94) = 0;
    *(undefined2 *)(pStmt + 0x98) = 0xff02;
    *(undefined4 *)(pStmt + 0x50) = 0xbdf20da3;
    *(undefined4 *)(pStmt + 0x9c) = 0;
    *(undefined8 *)(pStmt + 0x8c) = 0xffffffff00000001;
    *(undefined4 *)(pStmt + 0xa8) = 0;
    *(undefined8 *)(pStmt + 0xc0) = 0;
    iVar1 = sqlite3ApiExit(*(sqlite3 **)pStmt,iVar1);
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3_mutex_enter(v->db->mutex);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (v->db->errMask))==rc );
    rc = sqlite3ApiExit(v->db, rc);
    sqlite3_mutex_leave(v->db->mutex);
  }
  return rc;
}